

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O3

Vector * __thiscall duckdb::ConflictManager::InternalIntermediate(ConflictManager *this)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> this_01;
  type pVVar1;
  LogicalType local_30;
  
  this_00 = &this->intermediate_vector;
  if ((this->intermediate_vector).
      super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    this_01.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)operator_new(0x68);
    LogicalType::LogicalType(&local_30,BOOLEAN);
    Vector::Vector((Vector *)this_01.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl,
                   &local_30,true,true,this->input_size);
    LogicalType::~LogicalType(&local_30);
    __ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (this_00->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>;
    (this_00->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false> =
         this_01.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)this_00,
                 (Vector *)__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
  }
  pVVar1 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
  ;
  return pVVar1;
}

Assistant:

Vector &ConflictManager::InternalIntermediate() {
	if (!intermediate_vector) {
		intermediate_vector = make_uniq<Vector>(LogicalType::BOOLEAN, true, true, input_size);
	}
	return *intermediate_vector;
}